

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condexe.cc
# Opt level: O1

Varnode * __thiscall
ConditionalExecution::getNewMulti(ConditionalExecution *this,PcodeOp *op,BlockBasic *bl)

{
  pointer pBVar1;
  pointer pBVar2;
  Funcdata *this_00;
  Varnode *vn;
  int iVar3;
  PcodeOp *op_00;
  Varnode *pVVar4;
  int slot;
  Address local_40;
  
  pBVar1 = (bl->super_FlowBlock).intothis.super__Vector_base<BlockEdge,_std::allocator<BlockEdge>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pBVar2 = (bl->super_FlowBlock).intothis.super__Vector_base<BlockEdge,_std::allocator<BlockEdge>_>.
           _M_impl.super__Vector_impl_data._M_start;
  this_00 = this->fd;
  (*(bl->super_FlowBlock)._vptr_FlowBlock[2])(&local_40,bl);
  op_00 = Funcdata::newOp(this_00,(int)((ulong)((long)pBVar1 - (long)pBVar2) >> 3) * -0x55555555,
                          &local_40);
  vn = op->output;
  pVVar4 = Funcdata::newUniqueOut(this->fd,vn->size,op_00);
  Funcdata::opSetOpcode(this->fd,op_00,CPUI_MULTIEQUAL);
  if (0 < (int)((ulong)((long)(bl->super_FlowBlock).intothis.
                              super__Vector_base<BlockEdge,_std::allocator<BlockEdge>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(bl->super_FlowBlock).intothis.
                             super__Vector_base<BlockEdge,_std::allocator<BlockEdge>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
    slot = 0;
    do {
      Funcdata::opSetInput(this->fd,op_00,vn,slot);
      slot = slot + 1;
      iVar3 = (int)((ulong)((long)(bl->super_FlowBlock).intothis.
                                  super__Vector_base<BlockEdge,_std::allocator<BlockEdge>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)(bl->super_FlowBlock).intothis.
                                 super__Vector_base<BlockEdge,_std::allocator<BlockEdge>_>._M_impl.
                                 super__Vector_impl_data._M_start) >> 3);
    } while (SBORROW4(slot,iVar3 * -0x55555555) != slot + iVar3 * 0x55555555 < 0);
  }
  Funcdata::opInsertBegin(this->fd,op_00,bl);
  return pVVar4;
}

Assistant:

Varnode *ConditionalExecution::getNewMulti(PcodeOp *op,BlockBasic *bl)

{
  PcodeOp *newop = fd->newOp(bl->sizeIn(),bl->getStart());
  Varnode *outvn = op->getOut();
  Varnode *newoutvn;
  // Using the original outvn address may cause merge conflicts
  //  newoutvn = fd->newVarnodeOut(outvn->getSize(),outvn->getAddr(),newop);
  newoutvn = fd->newUniqueOut(outvn->getSize(),newop);
  fd->opSetOpcode(newop,CPUI_MULTIEQUAL);

  // We create NEW references to outvn, these refs will get put
  // at the end of the dependency list and will get handled in
  // due course
  for(int4 i=0;i<bl->sizeIn();++i)
    fd->opSetInput(newop,outvn,i);

  fd->opInsertBegin(newop,bl);
  return newoutvn;
}